

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,EseqExpression *eseq_expression)

{
  ostream *poVar1;
  
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"EseqExpression:");
  std::endl<char,std::char_traits<char>>(poVar1);
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(eseq_expression->statement_->super_BaseElement)._vptr_BaseElement[2])
            (eseq_expression->statement_,this);
  (*(eseq_expression->expression_->super_BaseElement)._vptr_BaseElement[2])
            (eseq_expression->expression_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(EseqExpression *eseq_expression) {
  PrintTabs();
  stream_ << "EseqExpression:" << std::endl;
  ++num_tabs_;
  eseq_expression->statement_->Accept(this);
  eseq_expression->expression_->Accept(this);
  --num_tabs_;

}